

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

int WebRtcAgc_GetAddFarendError(void *state,size_t samples)

{
  LegacyAgc *stt;
  size_t samples_local;
  void *state_local;
  
  if (state == (void *)0x0) {
    return -1;
  }
  if (*state == 8000) {
    if (samples != 0x50) {
      return -1;
    }
  }
  else {
    if (((*state != 16000) && (*state != 32000)) && (*state != 48000)) {
      return -1;
    }
    if (samples != 0xa0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int WebRtcAgc_GetAddFarendError(void *state, size_t samples) {
    LegacyAgc *stt;
    stt = (LegacyAgc *) state;

    if (stt == NULL) return -1;

    if (stt->fs == 8000) {
        if (samples != 80) return -1;
    } else if (stt->fs == 16000 || stt->fs == 32000 || stt->fs == 48000) {
        if (samples != 160) return -1;
    } else {
        return -1;
    }

    return 0;
}